

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O0

void jpeg_new_colormap(j_decompress_ptr cinfo)

{
  jpeg_decomp_master *pjVar1;
  my_master_ptr master;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->master;
  if (cinfo->global_state != 0xcf) {
    cinfo->err->msg_code = 0x15;
    (cinfo->err->msg_parm).i[0] = cinfo->global_state;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (((cinfo->quantize_colors == 0) || (cinfo->enable_external_quant == 0)) ||
     (cinfo->colormap == (JSAMPARRAY)0x0)) {
    cinfo->err->msg_code = 0x2f;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  else {
    cinfo->cquantize = *(jpeg_color_quantizer **)&pjVar1[1].is_dummy_pass;
    (*cinfo->cquantize->new_color_map)(cinfo);
    pjVar1->is_dummy_pass = 0;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_new_colormap (j_decompress_ptr cinfo)
{
  my_master_ptr master = (my_master_ptr) cinfo->master;

  /* Prevent application from calling me at wrong times */
  if (cinfo->global_state != DSTATE_BUFIMAGE)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  if (cinfo->quantize_colors && cinfo->enable_external_quant &&
      cinfo->colormap != NULL) {
    /* Select 2-pass quantizer for external colormap use */
    cinfo->cquantize = master->quantizer_2pass;
    /* Notify quantizer of colormap change */
    (*cinfo->cquantize->new_color_map) (cinfo);
    master->pub.is_dummy_pass = FALSE; /* just in case */
  } else
    ERREXIT(cinfo, JERR_MODE_CHANGE);
}